

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  GetterXsYs<int> *pGVar5;
  ImDrawVert *pIVar6;
  uint *puVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pGVar5 = this->Getter;
  iVar3 = pGVar5->Count;
  lVar8 = (long)(((pGVar5->Offset + prim + 1) % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride;
  iVar3 = this->Transformer->YAxis;
  fVar13 = (float)(((double)*(int *)((long)pGVar5->Xs + lVar8) -
                   (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                  (double)GImPlot->PixelRange[iVar3].Min.x);
  fVar14 = (float)(((double)*(int *)((long)pGVar5->Ys + lVar8) -
                   GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) * GImPlot->My[iVar3] +
                  (double)GImPlot->PixelRange[iVar3].Min.y);
  fVar12 = (this->P1).x;
  fVar15 = (this->P1).y;
  fVar11 = fVar15;
  if (fVar14 <= fVar15) {
    fVar11 = fVar14;
  }
  bVar9 = false;
  if ((fVar11 < (cull_rect->Max).y) &&
     (fVar11 = (float)(-(uint)(fVar14 <= fVar15) & (uint)fVar15 |
                      ~-(uint)(fVar14 <= fVar15) & (uint)fVar14), pfVar1 = &(cull_rect->Min).y,
     bVar9 = false, *pfVar1 <= fVar11 && fVar11 != *pfVar1)) {
    fVar11 = fVar12;
    if (fVar13 <= fVar12) {
      fVar11 = fVar13;
    }
    if (fVar11 < (cull_rect->Max).x) {
      fVar11 = (float)(~-(uint)(fVar13 <= fVar12) & (uint)fVar13 |
                      -(uint)(fVar13 <= fVar12) & (uint)fVar12);
      bVar9 = (cull_rect->Min).x <= fVar11 && fVar11 != (cull_rect->Min).x;
    }
  }
  if (bVar9 != false) {
    fVar11 = this->Weight;
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar12 = fVar13 - fVar12;
    fVar15 = fVar14 - fVar15;
    fVar10 = fVar12 * fVar12 + fVar15 * fVar15;
    if (0.0 < fVar10) {
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar12 = fVar12 * (1.0 / fVar10);
      fVar15 = fVar15 * (1.0 / fVar10);
    }
    fVar11 = fVar11 * 0.5;
    fVar12 = fVar12 * fVar11;
    fVar11 = fVar11 * fVar15;
    pIVar6 = DrawList->_VtxWritePtr;
    (pIVar6->pos).x = (this->P1).x + fVar11;
    (pIVar6->pos).y = (this->P1).y - fVar12;
    pIVar6->uv = IVar2;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = IVar4;
    pIVar6[1].pos.x = fVar11 + fVar13;
    pIVar6[1].pos.y = fVar14 - fVar12;
    pIVar6[1].uv = IVar2;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = IVar4;
    pIVar6[2].pos.x = fVar13 - fVar11;
    pIVar6[2].pos.y = fVar12 + fVar14;
    pIVar6[2].uv = IVar2;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = IVar4;
    pIVar6[3].pos.x = (this->P1).x - fVar11;
    pIVar6[3].pos.y = fVar12 + (this->P1).y;
    pIVar6[3].uv = IVar2;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar6 + 4;
    puVar7 = DrawList->_IdxWritePtr;
    *puVar7 = DrawList->_VtxCurrentIdx;
    puVar7[1] = DrawList->_VtxCurrentIdx + 1;
    puVar7[2] = DrawList->_VtxCurrentIdx + 2;
    puVar7[3] = DrawList->_VtxCurrentIdx;
    puVar7[4] = DrawList->_VtxCurrentIdx + 2;
    puVar7[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar7 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar2.y = fVar14;
  IVar2.x = fVar13;
  this->P1 = IVar2;
  return bVar9;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }